

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

reference __thiscall
QVLABase<QString>::emplace_back_impl<QString>
          (QVLABase<QString> *this,qsizetype prealloc,void *array,QString *args)

{
  qsizetype *pqVar1;
  long lVar2;
  QArrayDataPointer<char16_t> *this_00;
  
  lVar2 = (this->super_QVLABaseBase).s;
  if (lVar2 == (this->super_QVLABaseBase).a) {
    growBy(this,prealloc,array,1);
    lVar2 = (this->super_QVLABaseBase).s;
  }
  this_00 = (QArrayDataPointer<char16_t> *)(lVar2 * 0x18 + (long)(this->super_QVLABaseBase).ptr);
  QArrayDataPointer<char16_t>::QArrayDataPointer(this_00,&args->d);
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return (reference)this_00;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }